

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O0

int32 compute_dist(dist_t *out_dist,int32 n_top,vector_t obs,int32 featlen,vector_t *mean,
                  vector_t *var,float32 *det,int32 n_density)

{
  bool bVar1;
  undefined4 uVar2;
  dist_t *pdVar3;
  dist_t *pdVar4;
  float64 diff;
  float64 dval;
  vector_t v;
  vector_t m;
  dist_t *worst;
  int local_48;
  int32 d;
  int32 j;
  int32 i;
  vector_t *var_local;
  vector_t *mean_local;
  int32 featlen_local;
  vector_t obs_local;
  int32 n_top_local;
  dist_t *out_dist_local;
  
  if (n_top < n_density) {
    for (d = 0; d < n_top; d = d + 1) {
      out_dist[d].dist = 1.79769313486232e+308;
    }
    for (worst._4_4_ = 0; worst._4_4_ < n_density; worst._4_4_ = worst._4_4_ + 1) {
      diff = (float64)(double)(float)det[worst._4_4_];
      d = 0;
      while( true ) {
        bVar1 = false;
        if (d < featlen) {
          bVar1 = (double)diff <= (double)out_dist[n_top + -1].dist;
        }
        if (!bVar1) break;
        diff = (float64)((double)((float)obs[d] - (float)mean[worst._4_4_][d]) *
                         (double)((float)obs[d] - (float)mean[worst._4_4_][d]) *
                         (double)(float)var[worst._4_4_][d] + (double)diff);
        d = d + 1;
      }
      if ((featlen <= d) && ((double)diff < (double)out_dist[n_top + -1].dist)) {
        d = 0;
        while( true ) {
          bVar1 = false;
          if (d < n_top) {
            bVar1 = (double)out_dist[d].dist <= (double)diff;
          }
          if (!bVar1) break;
          d = d + 1;
        }
        if (n_top <= d) {
          __assert_fail("i < n_top",
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/ms_gauden.c"
                        ,0x248,
                        "int32 compute_dist(dist_t *, int32, vector_t, int32, vector_t *, vector_t *, float32 *, int32)"
                       );
        }
        for (local_48 = n_top + -1; d < local_48; local_48 = local_48 + -1) {
          pdVar3 = out_dist + local_48;
          pdVar4 = out_dist + (local_48 + -1);
          uVar2 = *(undefined4 *)&pdVar4->field_0x4;
          pdVar3->id = pdVar4->id;
          *(undefined4 *)&pdVar3->field_0x4 = uVar2;
          pdVar3->dist = pdVar4->dist;
        }
        out_dist[d].dist = diff;
        out_dist[d].id = worst._4_4_;
      }
    }
    out_dist_local._4_4_ = 0;
  }
  else {
    out_dist_local._4_4_ = compute_dist_all(out_dist,obs,featlen,mean,var,det,n_density);
  }
  return out_dist_local._4_4_;
}

Assistant:

static int32
compute_dist(dist_t * out_dist, int32 n_top,
             vector_t obs, int32 featlen,
             vector_t * mean, vector_t * var, float32 * det,
             int32 n_density)
{
    int32 i, j, d;
    dist_t *worst;
    vector_t m, v;
    float64 dval, diff;

    /* Special case optimization when n_density <= n_top */
    if (n_top >= n_density)
        return (compute_dist_all
                (out_dist, obs, featlen, mean, var, det, n_density));

    /*
     * We are really computing denominators in the gaussian density expression:
     *   sqrt(2pi * det), and (x-mean)^2*var.
     * To maximize the density value, we want to minimize the denominators.
     */

    for (i = 0; i < n_top; i++)
        out_dist[i].dist = DBL_MAX;
    worst = &(out_dist[n_top - 1]);

    for (d = 0; d < n_density; d++) {
        m = mean[d];
        v = var[d];
        dval = det[d];

        for (i = 0; (i < featlen) && (dval <= worst->dist); i++) {
            diff = obs[i] - m[i];
            dval += diff * diff * v[i];
        }

        if ((i < featlen) || (dval >= worst->dist))     /* Codeword d worse than worst */
            continue;

        /* Codeword d at least as good as worst so far; insert in the ordered list */
        for (i = 0; (i < n_top) && (dval >= out_dist[i].dist); i++);
        assert(i < n_top);
        for (j = n_top - 1; j > i; --j)
            out_dist[j] = out_dist[j - 1];
        out_dist[i].dist = dval;
        out_dist[i].id = d;
    }

    return 0;
}